

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O2

bool __thiscall Js::ByteCodeWriter::DoProfileNewScArrayOp(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  
  uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,NativeArrayPhase,uVar3,LVar4);
  if (!bVar1) {
    uVar3 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
    LVar4 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,NativeNewScArrayPhase,uVar3,LVar4);
    if (!bVar1) {
      bVar1 = FunctionProxy::IsInDebugMode((FunctionProxy *)this->m_functionWrite);
      if ((!bVar1) && ((ushort)(op - NewScArray) < 6)) {
        bVar2 = 0x29 >> ((byte)(op - NewScArray) & 0x1f);
        goto LAB_00774776;
      }
    }
  }
  bVar2 = 0;
LAB_00774776:
  return (bool)(bVar2 & 1);
}

Assistant:

bool DoProfileNewScArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !PHASE_OFF(NativeNewScArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScIntArray || op == OpCode::NewScFltArray || op == OpCode::NewScArray);
        }